

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O1

void __thiscall
duckdb::PositionalJoinGlobalState::Execute
          (PositionalJoinGlobalState *this,DataChunk *input,DataChunk *output)

{
  pointer pVVar1;
  pointer pVVar2;
  idx_t count;
  int iVar3;
  reference this_00;
  reference other;
  size_type __n;
  idx_t col_offset;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->rhs_lock);
  if (iVar3 == 0) {
    pVVar1 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar2 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    col_offset = ((long)pVVar1 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (pVVar1 != pVVar2) {
      __n = 0;
      do {
        this_00 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
        other = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
        Vector::Reference(this_00,other);
        __n = __n + 1;
      } while (col_offset + (col_offset == 0) != __n);
    }
    count = input->count;
    InitializeScan(this);
    Refill(this);
    CopyData(this,output,count,col_offset);
    output->count = count;
    pthread_mutex_unlock((pthread_mutex_t *)&this->rhs_lock);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void PositionalJoinGlobalState::Execute(DataChunk &input, DataChunk &output) {
	lock_guard<mutex> client_guard(rhs_lock);

	// Reference the input and assume it will be full
	const auto col_offset = input.ColumnCount();
	for (idx_t i = 0; i < col_offset; ++i) {
		output.data[i].Reference(input.data[i]);
	}

	// Copy or reference the RHS columns
	const auto count = input.size();
	InitializeScan();
	Refill();
	CopyData(output, count, col_offset);

	output.SetCardinality(count);
}